

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.h
# Opt level: O3

void __thiscall chrono::robosimian::RS_Part::~RS_Part(RS_Part *this)

{
  pointer pcVar1;
  pointer pCVar2;
  pointer pSVar3;
  pointer pBVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  this->_vptr_RS_Part = (_func_int **)&PTR__RS_Part_0017d9d0;
  paVar6 = &(this->m_mesh_name).field_2;
  pcVar1 = (this->m_mesh_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar6) {
    operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
  }
  std::vector<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>::
  ~vector(&this->m_meshes);
  pCVar2 = (this->m_cylinders).
           super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2,(long)(this->m_cylinders).
                                 super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar2);
  }
  pSVar3 = (this->m_spheres).
           super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)(this->m_spheres).
                                 super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3);
  }
  pBVar4 = (this->m_boxes).
           super__Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar4 != (pointer)0x0) {
    operator_delete(pBVar4,(long)(this->m_boxes).
                                 super__Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar4);
  }
  p_Var5 = (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar6 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar6) {
    operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~RS_Part() {}